

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

uchar get_decimal_point(void)

{
  lconv *plVar1;
  
  plVar1 = localeconv();
  return *plVar1->decimal_point;
}

Assistant:

static unsigned char get_decimal_point(void)
{
#ifdef ENABLE_LOCALES
    struct lconv *lconv = localeconv();
    return (unsigned char) lconv->decimal_point[0];
#else
    return '.';
#endif
}